

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeSetStringSpan::UnicodeSetStringSpan
          (UnicodeSetStringSpan *this,UnicodeSet *set,UVector *setStrings,uint32_t which)

{
  UnicodeSet *this_00;
  ushort uVar1;
  bool bVar2;
  uint8_t uVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  int32_t iVar7;
  void *pvVar8;
  int32_t *piVar9;
  uint8_t *puVar10;
  UChar *s;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint8_t *puVar14;
  UErrorCode errorCode;
  int32_t local_78;
  UErrorCode local_74;
  UChar *local_70;
  int local_64;
  UnicodeSet *local_60;
  ulong local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  int32_t **local_40;
  uint8_t *local_38;
  
  this_00 = &this->spanSet;
  UnicodeSet::UnicodeSet(this_00,0,0x10ffff);
  this->pSpanNotSet = (UnicodeSet *)0x0;
  this->strings = setStrings;
  this->utf8Lengths = (int32_t *)0x0;
  this->spanLengths = (uint8_t *)0x0;
  this->utf8 = (uint8_t *)0x0;
  this->utf8Length = 0;
  this->maxLength16 = 0;
  this->maxLength8 = 0;
  this->all = which == 0x3f;
  local_60 = this_00;
  UnicodeSet::retainAll(this_00,set);
  if ((which & 1) != 0) {
    this->pSpanNotSet = local_60;
  }
  uVar6 = this->strings->count;
  local_58 = (ulong)uVar6;
  if ((int)uVar6 < 1) goto LAB_001807bc;
  local_40 = &this->utf8Lengths;
  iVar12 = 0;
  bVar2 = false;
  do {
    pvVar8 = UVector::elementAt(this->strings,iVar12);
    uVar1 = *(ushort *)((long)pvVar8 + 8);
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        s = *(UChar **)((long)pvVar8 + 0x18);
      }
      else {
        s = (UChar *)((long)pvVar8 + 10);
      }
    }
    else {
      s = (UChar *)0x0;
    }
    if ((short)uVar1 < 0) {
      iVar7 = *(int32_t *)((long)pvVar8 + 0xc);
    }
    else {
      iVar7 = (int)(short)uVar1 >> 5;
    }
    iVar4 = UnicodeSet::span(local_60,s,iVar7,USET_SPAN_CONTAINED);
    if (iVar4 < iVar7) {
      bVar2 = true;
    }
    if (((which & 8) != 0) && (this->maxLength16 < iVar7)) {
      this->maxLength16 = iVar7;
    }
    if (((which & 4) != 0) && ((which & 2) != 0 || iVar4 < iVar7)) {
      local_74 = U_ZERO_ERROR;
      local_78 = 0;
      u_strToUTF8_63((char *)0x0,0,&local_78,s,iVar7,&local_74);
      iVar5 = 0;
      if (local_74 == U_BUFFER_OVERFLOW_ERROR) {
        iVar5 = local_78;
      }
      if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar5 = local_78;
      }
      this->utf8Length = this->utf8Length + iVar5;
      if (this->maxLength8 < iVar5) {
        this->maxLength8 = iVar5;
      }
    }
    iVar12 = iVar12 + 1;
  } while ((int)local_58 != iVar12);
  if (!bVar2) goto LAB_001807bc;
  if (this->all != '\0') {
    UnicodeSet::freeze(local_60);
  }
  uVar6 = (uint)local_58;
  if (this->all == '\0') {
    if ((which & 4) != 0) {
      iVar12 = uVar6 * 5;
      goto LAB_0018074a;
    }
  }
  else {
    iVar12 = uVar6 << 3;
LAB_0018074a:
    uVar6 = iVar12 + this->utf8Length;
  }
  if ((int)uVar6 < 0x81) {
    this->utf8Lengths = this->staticLengths;
  }
  else {
    piVar9 = (int32_t *)uprv_malloc_63((ulong)uVar6);
    *local_40 = piVar9;
    if (piVar9 == (int32_t *)0x0) {
LAB_001807bc:
      this->maxLength16 = 0;
      this->maxLength8 = 0;
      return;
    }
  }
  if (this->all == '\0') {
    if ((which & 4) == 0) {
      this->spanLengths = (uint8_t *)*local_40;
    }
    else {
      piVar9 = *local_40 + local_58;
      this->spanLengths = (uint8_t *)piVar9;
      this->utf8 = (uint8_t *)((long)piVar9 + local_58);
    }
    local_50 = this->spanLengths;
    local_48 = local_50;
    local_38 = local_50;
  }
  else {
    this->spanLengths = (uint8_t *)(this->utf8Lengths + local_58);
    local_38 = (uint8_t *)((long)(this->utf8Lengths + local_58) + local_58);
    local_50 = local_38 + local_58;
    local_48 = local_50 + local_58;
    this->utf8 = local_48 + local_58;
  }
  uVar13 = 0;
  local_64 = 0;
  do {
    pvVar8 = UVector::elementAt(this->strings,(int32_t)uVar13);
    uVar1 = *(ushort *)((long)pvVar8 + 8);
    if ((uVar1 & 0x11) == 0) {
      if ((uVar1 & 2) == 0) {
        local_70 = *(UChar **)((long)pvVar8 + 0x18);
      }
      else {
        local_70 = (UChar *)((long)pvVar8 + 10);
      }
    }
    else {
      local_70 = (UChar *)0x0;
    }
    if ((short)uVar1 < 0) {
      uVar6 = *(uint *)((long)pvVar8 + 0xc);
    }
    else {
      uVar6 = (int)(short)uVar1 >> 5;
    }
    iVar7 = UnicodeSet::span(local_60,local_70,uVar6,USET_SPAN_CONTAINED);
    if (iVar7 < (int)uVar6) {
      if ((which & 8) != 0) {
        if ((which & 2) == 0) {
          local_38[uVar13] = '\0';
          uVar3 = '\0';
          puVar14 = this->spanLengths;
        }
        else {
          if ((which & 0x20) != 0) {
            uVar3 = (uint8_t)iVar7;
            if (0xfd < iVar7) {
              uVar3 = 0xfe;
            }
            this->spanLengths[uVar13] = uVar3;
          }
          if ((which & 0x10) == 0) goto LAB_00180913;
          iVar7 = UnicodeSet::spanBack(local_60,local_70,uVar6,USET_SPAN_CONTAINED);
          iVar12 = uVar6 - iVar7;
          if (0xfd < (int)(uVar6 - iVar7)) {
            iVar12 = 0xfe;
          }
          uVar3 = (uint8_t)iVar12;
          puVar14 = local_38;
        }
        puVar14[uVar13] = uVar3;
      }
LAB_00180913:
      if ((which & 4) != 0) {
        puVar14 = this->utf8 + local_64;
        local_74 = U_ZERO_ERROR;
        local_78 = 0;
        u_strToUTF8_63((char *)puVar14,this->utf8Length - local_64,&local_78,local_70,uVar6,
                       &local_74);
        iVar12 = 0;
        if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar12 = local_78;
        }
        (*local_40)[uVar13] = iVar12;
        local_64 = local_64 + iVar12;
        puVar10 = local_50;
        if (iVar12 == 0) {
          local_48[uVar13] = 0xff;
          uVar3 = 0xff;
        }
        else if ((which & 2) == 0) {
          local_48[uVar13] = '\0';
          uVar3 = '\0';
        }
        else {
          if ((which & 0x20) != 0) {
            iVar7 = UnicodeSet::spanUTF8(local_60,(char *)puVar14,iVar12,USET_SPAN_CONTAINED);
            uVar3 = (uint8_t)iVar7;
            if (0xfd < iVar7) {
              uVar3 = 0xfe;
            }
            local_50[uVar13] = uVar3;
          }
          if ((which & 0x10) == 0) goto LAB_00180a30;
          iVar7 = UnicodeSet::spanBackUTF8(local_60,(char *)puVar14,iVar12,USET_SPAN_CONTAINED);
          iVar5 = iVar12 - iVar7;
          if (0xfd < iVar12 - iVar7) {
            iVar5 = 0xfe;
          }
          uVar3 = (uint8_t)iVar5;
          puVar10 = local_48;
        }
        puVar10[uVar13] = uVar3;
      }
LAB_00180a30:
      if ((which & 1) != 0) {
        if ((which & 0x20) != 0) {
          uVar11 = (uint)(ushort)*local_70;
          if (((uVar6 != 1) && ((uVar11 & 0xfc00) == 0xd800)) &&
             (((ushort)local_70[1] & 0xfc00) == 0xdc00)) {
            uVar11 = (uint)(ushort)*local_70 * 0x400 + (uint)(ushort)local_70[1] + 0xfca02400;
          }
          addToSpanNotSet(this,uVar11);
        }
        if ((which & 0x10) != 0) {
          uVar11 = (uint)(ushort)local_70[(long)(int)uVar6 + -1];
          if (((1 < (int)uVar6) && ((uVar11 & 0xfc00) == 0xdc00)) &&
             ((local_70[(ulong)uVar6 - 2] & 0xfc00U) == 0xd800)) {
            uVar11 = (uint)(ushort)local_70[(long)(int)uVar6 + -1] +
                     (uint)(ushort)local_70[(ulong)uVar6 - 2] * 0x400 + 0xfca02400;
          }
          addToSpanNotSet(this,uVar11);
        }
      }
    }
    else {
      if ((which & 4) != 0) {
        if ((which & 2) == 0) {
          (*local_40)[uVar13] = 0;
        }
        else {
          local_74 = U_ZERO_ERROR;
          local_78 = 0;
          u_strToUTF8_63((char *)(this->utf8 + local_64),this->utf8Length - local_64,&local_78,
                         local_70,uVar6,&local_74);
          iVar12 = 0;
          if (local_74 < U_ILLEGAL_ARGUMENT_ERROR) {
            iVar12 = local_78;
          }
          (*local_40)[uVar13] = iVar12;
          local_64 = local_64 + iVar12;
        }
      }
      if (this->all != '\0') {
        local_48[uVar13] = 0xff;
        local_50[uVar13] = 0xff;
        local_38[uVar13] = 0xff;
      }
      this->spanLengths[uVar13] = 0xff;
    }
    uVar13 = uVar13 + 1;
    if (local_58 == uVar13) {
      if (this->all == '\0') {
        return;
      }
      UnicodeSet::freeze(this->pSpanNotSet);
      return;
    }
  } while( true );
}

Assistant:

UnicodeSetStringSpan::UnicodeSetStringSpan(const UnicodeSet &set,
                                           const UVector &setStrings,
                                           uint32_t which)
        : spanSet(0, 0x10ffff), pSpanNotSet(NULL), strings(setStrings),
          utf8Lengths(NULL), spanLengths(NULL), utf8(NULL),
          utf8Length(0),
          maxLength16(0), maxLength8(0),
          all((UBool)(which==ALL)) {
    spanSet.retainAll(set);
    if(which&NOT_CONTAINED) {
        // Default to the same sets.
        // addToSpanNotSet() will create a separate set if necessary.
        pSpanNotSet=&spanSet;
    }

    // Determine if the strings even need to be taken into account at all for span() etc.
    // If any string is relevant, then all strings need to be used for
    // span(longest match) but only the relevant ones for span(while contained).
    // TODO: Possible optimization: Distinguish CONTAINED vs. LONGEST_MATCH
    //   and do not store UTF-8 strings if !thisRelevant and CONTAINED.
    //   (Only store irrelevant UTF-8 strings for LONGEST_MATCH where they are relevant after all.)
    // Also count the lengths of the UTF-8 versions of the strings for memory allocation.
    int32_t stringsLength=strings.size();

    int32_t i, spanLength;
    UBool someRelevant=FALSE;
    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        UBool thisRelevant;
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            someRelevant=thisRelevant=TRUE;
        } else {
            thisRelevant=FALSE;
        }
        if((which&UTF16) && length16>maxLength16) {
            maxLength16=length16;
        }
        if((which&UTF8) && (thisRelevant || (which&CONTAINED))) {
            int32_t length8=getUTF8Length(s16, length16);
            utf8Length+=length8;
            if(length8>maxLength8) {
                maxLength8=length8;
            }
        }
    }
    if(!someRelevant) {
        maxLength16=maxLength8=0;
        return;
    }

    // Freeze after checking for the need to use strings at all because freezing
    // a set takes some time and memory which are wasted if there are no relevant strings.
    if(all) {
        spanSet.freeze();
    }

    uint8_t *spanBackLengths;
    uint8_t *spanUTF8Lengths;
    uint8_t *spanBackUTF8Lengths;

    // Allocate a block of meta data.
    int32_t allocSize;
    if(all) {
        // UTF-8 lengths, 4 sets of span lengths, UTF-8 strings.
        allocSize=stringsLength*(4+1+1+1+1)+utf8Length;
    } else {
        allocSize=stringsLength;  // One set of span lengths.
        if(which&UTF8) {
            // UTF-8 lengths and UTF-8 strings.
            allocSize+=stringsLength*4+utf8Length;
        }
    }
    if(allocSize<=(int32_t)sizeof(staticLengths)) {
        utf8Lengths=staticLengths;
    } else {
        utf8Lengths=(int32_t *)uprv_malloc(allocSize);
        if(utf8Lengths==NULL) {
            maxLength16=maxLength8=0;  // Prevent usage by making needsStringSpanUTF16/8() return FALSE.
            return;  // Out of memory.
        }
    }

    if(all) {
        // Store span lengths for all span() variants.
        spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
        spanBackLengths=spanLengths+stringsLength;
        spanUTF8Lengths=spanBackLengths+stringsLength;
        spanBackUTF8Lengths=spanUTF8Lengths+stringsLength;
        utf8=spanBackUTF8Lengths+stringsLength;
    } else {
        // Store span lengths for only one span() variant.
        if(which&UTF8) {
            spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
            utf8=spanLengths+stringsLength;
        } else {
            spanLengths=(uint8_t *)utf8Lengths;
        }
        spanBackLengths=spanUTF8Lengths=spanBackUTF8Lengths=spanLengths;
    }

    // Set the meta data and pSpanNotSet and write the UTF-8 strings.
    int32_t utf8Count=0;  // Count UTF-8 bytes written so far.

    for(i=0; i<stringsLength; ++i) {
        const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
        const UChar *s16=string.getBuffer();
        int32_t length16=string.length();
        spanLength=spanSet.span(s16, length16, USET_SPAN_CONTAINED);
        if(spanLength<length16) {  // Relevant string.
            if(which&UTF16) {
                if(which&CONTAINED) {
                    if(which&FWD) {
                        spanLengths[i]=makeSpanLengthByte(spanLength);
                    }
                    if(which&BACK) {
                        spanLength=length16-spanSet.spanBack(s16, length16, USET_SPAN_CONTAINED);
                        spanBackLengths[i]=makeSpanLengthByte(spanLength);
                    }
                } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                    spanLengths[i]=spanBackLengths[i]=0;  // Only store a relevant/irrelevant flag.
                }
            }
            if(which&UTF8) {
                uint8_t *s8=utf8+utf8Count;
                int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                utf8Count+=utf8Lengths[i]=length8;
                if(length8==0) {  // Irrelevant for UTF-8 because not representable in UTF-8.
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=(uint8_t)ALL_CP_CONTAINED;
                } else {  // Relevant for UTF-8.
                    if(which&CONTAINED) {
                        if(which&FWD) {
                            spanLength=spanSet.spanUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                        if(which&BACK) {
                            spanLength=length8-spanSet.spanBackUTF8((const char *)s8, length8, USET_SPAN_CONTAINED);
                            spanBackUTF8Lengths[i]=makeSpanLengthByte(spanLength);
                        }
                    } else /* not CONTAINED, not all, but NOT_CONTAINED */ {
                        spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=0;  // Only store a relevant/irrelevant flag.
                    }
                }
            }
            if(which&NOT_CONTAINED) {
                // Add string start and end code points to the spanNotSet so that
                // a span(while not contained) stops before any string.
                UChar32 c;
                if(which&FWD) {
                    int32_t len=0;
                    U16_NEXT(s16, len, length16, c);
                    addToSpanNotSet(c);
                }
                if(which&BACK) {
                    int32_t len=length16;
                    U16_PREV(s16, 0, len, c);
                    addToSpanNotSet(c);
                }
            }
        } else {  // Irrelevant string.
            if(which&UTF8) {
                if(which&CONTAINED) {  // Only necessary for LONGEST_MATCH.
                    uint8_t *s8=utf8+utf8Count;
                    int32_t length8=appendUTF8(s16, length16, s8, utf8Length-utf8Count);
                    utf8Count+=utf8Lengths[i]=length8;
                } else {
                    utf8Lengths[i]=0;
                }
            }
            if(all) {
                spanLengths[i]=spanBackLengths[i]=
                    spanUTF8Lengths[i]=spanBackUTF8Lengths[i]=
                        (uint8_t)ALL_CP_CONTAINED;
            } else {
                // All spanXYZLengths pointers contain the same address.
                spanLengths[i]=(uint8_t)ALL_CP_CONTAINED;
            }
        }
    }

    // Finish.
    if(all) {
        pSpanNotSet->freeze();
    }
}